

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_blocking_q.h
# Opt level: O2

void __thiscall
spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::mpmc_blocking_queue
          (mpmc_blocking_queue<spdlog::details::async_msg> *this,size_t max_items)

{
  *(undefined8 *)((long)&(this->queue_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->queue_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->queue_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->queue_mutex_).super___mutex_base._M_mutex + 8) = 0;
  (this->queue_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->push_cv_);
  std::condition_variable::condition_variable(&this->pop_cv_);
  circular_q<spdlog::details::async_msg>::circular_q(&this->q_,max_items);
  return;
}

Assistant:

explicit mpmc_blocking_queue(size_t max_items)
        : q_(max_items)
    {}